

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute.cpp
# Opt level: O0

ostream * cali::operator<<(ostream *os,Attribute *a)

{
  int prop;
  cali_attr_type type;
  ostream *poVar1;
  cali_id_t cVar2;
  char *pcVar3;
  string local_138;
  char local_118 [8];
  char buf [256];
  Attribute *a_local;
  ostream *os_local;
  
  buf._248_8_ = a;
  prop = Attribute::properties(a);
  cali_prop2string(prop,local_118,0x100);
  poVar1 = std::operator<<(os,"{ \"id\" : ");
  cVar2 = Attribute::id((Attribute *)buf._248_8_);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,cVar2);
  poVar1 = std::operator<<(poVar1,", \"name\" : \"");
  Attribute::name_abi_cxx11_(&local_138,(Attribute *)buf._248_8_);
  poVar1 = std::operator<<(poVar1,(string *)&local_138);
  poVar1 = std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(poVar1,", \"type\" : \"");
  type = Attribute::type((Attribute *)buf._248_8_);
  pcVar3 = cali_type2string(type);
  poVar1 = std::operator<<(poVar1,pcVar3);
  poVar1 = std::operator<<(poVar1,"\"");
  poVar1 = std::operator<<(poVar1,", \"properties\" : \"");
  poVar1 = std::operator<<(poVar1,local_118);
  poVar1 = std::operator<<(poVar1,"\" }");
  std::__cxx11::string::~string((string *)&local_138);
  return poVar1;
}

Assistant:

std::ostream& cali::operator<< (std::ostream& os, const Attribute& a)
{
    char buf[256];

    cali_prop2string(a.properties(), buf, 256);

    return os << "{ \"id\" : " << a.id() << ", \"name\" : \"" << a.name() << "\""
              << ", \"type\" : \"" << cali_type2string(a.type()) << "\""
              << ", \"properties\" : \"" << buf << "\" }";
}